

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::prepareForInsertHelper
          (NumberStringBuilder *this,int32_t index,int32_t count,UErrorCode *status)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  UNumberFormatFields *pUVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ValueOrHeapArray<char16_t> *buffer;
  int iVar10;
  ValueOrHeapArray<UNumberFormatFields> *buffer_00;
  bool bVar11;
  
  bVar11 = this->fUsingHeap != false;
  iVar3 = 0x28;
  if (bVar11) {
    iVar3 = (this->fChars).heap.capacity;
  }
  lVar6 = (long)this->fZero;
  buffer = &this->fChars;
  if (bVar11) {
    buffer = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
  }
  buffer_00 = &this->fFields;
  if (bVar11) {
    buffer_00 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
  }
  iVar2 = this->fLength;
  lVar8 = (long)count;
  uVar1 = iVar2 + lVar8;
  iVar10 = (int)uVar1;
  iVar7 = -((int)(((uint)(uVar1 >> 0x1f) & 1) + iVar10) >> 1);
  if (iVar3 < iVar10) {
    pcVar4 = (char16_t *)uprv_malloc_63(uVar1 * 4);
    pUVar5 = (UNumberFormatFields *)uprv_malloc_63(uVar1 * 8);
    if (pUVar5 == (UNumberFormatFields *)0x0 || pcVar4 == (char16_t *)0x0) {
      uprv_free_63(pcVar4);
      uprv_free_63(pUVar5);
      *status = U_MEMORY_ALLOCATION_ERROR;
      return -1;
    }
    iVar7 = iVar7 + iVar10;
    lVar9 = (long)index;
    if (index != 0) {
      memcpy(pcVar4 + iVar7,buffer->value + lVar6,lVar9 * 2);
    }
    iVar3 = this->fLength;
    iVar2 = iVar3 - index;
    if (iVar2 != 0) {
      memcpy(pcVar4 + iVar7 + lVar9 + lVar8,buffer->value + lVar6 + lVar9,(long)iVar2 * 2);
    }
    if (index != 0) {
      memcpy(pUVar5 + iVar7,buffer_00->value + lVar6,lVar9 * 4);
    }
    if (iVar3 != index) {
      memcpy(pUVar5 + iVar7 + lVar9 + lVar8,buffer_00->value + lVar6 + lVar9,(long)iVar2 << 2);
    }
    if (this->fUsingHeap == true) {
      uprv_free_63(buffer);
      uprv_free_63(buffer_00);
    }
    this->fUsingHeap = true;
    (this->fChars).heap.ptr = pcVar4;
    (this->fChars).heap.capacity = iVar10 * 2;
    (this->fFields).heap.ptr = pUVar5;
    (this->fFields).value[2] = iVar10 * 2;
  }
  else {
    iVar7 = iVar7 + iVar3 / 2;
    pcVar4 = buffer->value + iVar7;
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      memmove(pcVar4,(void *)((long)buffer + lVar6 * 2),(long)iVar2 * 2);
      iVar3 = this->fLength;
    }
    iVar2 = index;
    if (iVar3 - index != 0) {
      memmove(pcVar4 + index + lVar8,pcVar4 + index,(long)(iVar3 - index) * 2);
      iVar2 = this->fLength;
    }
    pUVar5 = buffer_00->value + iVar7;
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      memmove(pUVar5,(void *)((long)buffer_00 + lVar6 * 4),(long)iVar2 << 2);
      iVar3 = this->fLength;
    }
    if (iVar3 - index != 0) {
      memmove(pUVar5 + index + lVar8,pUVar5 + index,(long)(iVar3 - index) << 2);
    }
  }
  this->fZero = iVar7;
  this->fLength = this->fLength + count;
  return index + iVar7;
}

Assistant:

int32_t NumberStringBuilder::prepareForInsertHelper(int32_t index, int32_t count, UErrorCode &status) {
    int32_t oldCapacity = getCapacity();
    int32_t oldZero = fZero;
    char16_t *oldChars = getCharPtr();
    Field *oldFields = getFieldPtr();
    if (fLength + count > oldCapacity) {
        int32_t newCapacity = (fLength + count) * 2;
        int32_t newZero = newCapacity / 2 - (fLength + count) / 2;

        // C++ note: malloc appears in two places: here and in the assignment operator.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * newCapacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * newCapacity));
        if (newChars == nullptr || newFields == nullptr) {
            uprv_free(newChars);
            uprv_free(newFields);
            status = U_MEMORY_ALLOCATION_ERROR;
            return -1;
        }

        // First copy the prefix and then the suffix, leaving room for the new chars that the
        // caller wants to insert.
        // C++ note: memcpy is OK because the src and dest do not overlap.
        uprv_memcpy2(newChars + newZero, oldChars + oldZero, sizeof(char16_t) * index);
        uprv_memcpy2(newChars + newZero + index + count,
                oldChars + oldZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memcpy2(newFields + newZero, oldFields + oldZero, sizeof(Field) * index);
        uprv_memcpy2(newFields + newZero + index + count,
                oldFields + oldZero + index,
                sizeof(Field) * (fLength - index));

        if (fUsingHeap) {
            uprv_free(oldChars);
            uprv_free(oldFields);
        }
        fUsingHeap = true;
        fChars.heap.ptr = newChars;
        fChars.heap.capacity = newCapacity;
        fFields.heap.ptr = newFields;
        fFields.heap.capacity = newCapacity;
        fZero = newZero;
        fLength += count;
    } else {
        int32_t newZero = oldCapacity / 2 - (fLength + count) / 2;

        // C++ note: memmove is required because src and dest may overlap.
        // First copy the entire string to the location of the prefix, and then move the suffix
        // to make room for the new chars that the caller wants to insert.
        uprv_memmove2(oldChars + newZero, oldChars + oldZero, sizeof(char16_t) * fLength);
        uprv_memmove2(oldChars + newZero + index + count,
                oldChars + newZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memmove2(oldFields + newZero, oldFields + oldZero, sizeof(Field) * fLength);
        uprv_memmove2(oldFields + newZero + index + count,
                oldFields + newZero + index,
                sizeof(Field) * (fLength - index));

        fZero = newZero;
        fLength += count;
    }
    return fZero + index;
}